

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  PrimitiveInstantiationSyntax *pPVar1;
  Token TVar2;
  Token TVar3;
  Token *unaff_retaddr;
  BumpAllocator *in_stack_00000038;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000040;
  BumpAllocator *in_stack_000000d8;
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *in_stack_000000e0;
  BumpAllocator *in_stack_ffffffffffffff88;
  TimingControlSyntax *in_stack_ffffffffffffff90;
  TimingControlSyntax *local_60;
  NetStrengthSyntax *local_58;
  
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000040,in_stack_00000038);
  TVar2 = parsing::Token::deepClone((Token *)in_stack_000000e0,in_stack_000000d8);
  if (*(long *)(__fn + 0x60) == 0) {
    local_58 = (NetStrengthSyntax *)0x0;
  }
  else {
    local_58 = deepClone<slang::syntax::NetStrengthSyntax>
                         ((NetStrengthSyntax *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  if (*(long *)(__fn + 0x68) == 0) {
    local_60 = (TimingControlSyntax *)0x0;
  }
  else {
    local_60 = deepClone<slang::syntax::TimingControlSyntax>
                         (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  deepClone<slang::syntax::HierarchicalInstanceSyntax>(in_stack_000000e0,in_stack_000000d8);
  TVar3 = parsing::Token::deepClone((Token *)in_stack_000000e0,in_stack_000000d8);
  pPVar1 = BumpAllocator::
           emplace<slang::syntax::PrimitiveInstantiationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::NetStrengthSyntax*,slang::syntax::TimingControlSyntax*,slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)TVar2.info,TVar2._0_8_,
                      (NetStrengthSyntax **)local_58,(TimingControlSyntax **)local_60,
                      (SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *)TVar3.info,
                      unaff_retaddr);
  return (int)pPVar1;
}

Assistant:

static SyntaxNode* clone(const PrimitiveInstantiationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<PrimitiveInstantiationSyntax>(
        *deepClone(node.attributes, alloc),
        node.type.deepClone(alloc),
        node.strength ? deepClone(*node.strength, alloc) : nullptr,
        node.delay ? deepClone(*node.delay, alloc) : nullptr,
        *deepClone(node.instances, alloc),
        node.semi.deepClone(alloc)
    );
}